

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple.cc
# Opt level: O2

int main(void)

{
  int iVar1;
  bool bVar2;
  ThreadPool local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  ThreadPool t;
  
  ThreadPool::ThreadPool(&t,true);
  iVar1 = 0x14;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    ThreadPool::submit<void(&)()>(local_e0,(_func_void *)&t);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
  }
  WorkItemScheduler::~WorkItemScheduler((WorkItemScheduler *)&t);
  return 0;
}

Assistant:

int main(void)
{
    ThreadPool t;

    for (int i = 0; i < 20; ++i)
        t.submit(long_work);

    return 0;
}